

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::Lookup::findAssertionLocalVar
               (ASTContext *context,NameSyntax *syntax,LookupResult *result)

{
  SyntaxKind SVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  LookupResult *result_00;
  pointer ppVar5;
  undefined8 *in_RDX;
  SyntaxNode *in_RSI;
  long in_RDI;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
  in_stack_00000000;
  NameComponents in_stack_00000120;
  const_iterator it;
  flat_hash_map<std::string_view,_const_Symbol_*> *map;
  AssertionInstanceDetails *inst;
  NameComponents name;
  NameSyntax *first;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int colonParts;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffba8;
  NameComponents *in_stack_fffffffffffffbb0;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *in_stack_fffffffffffffbb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbc8;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffbd0;
  int *in_stack_fffffffffffffc00;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *in_stack_fffffffffffffc08;
  ScopedNameSyntax *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  NameComponents *in_stack_fffffffffffffc30;
  bitmask<slang::ast::LookupFlags> local_36c;
  Scope *local_368;
  SymbolIndex SStack_360;
  undefined4 uStack_35c;
  underlying_type local_358;
  Symbol *pSStack_350;
  TempVarSymbol *local_348;
  RandomizeDetails *pRStack_340;
  AssertionInstanceDetails *local_338;
  const_iterator local_318;
  char_pointer local_308;
  table_element_pointer_conflict local_300;
  long local_2f8;
  long local_2f0;
  undefined1 local_2e8 [56];
  ASTContext local_2b0;
  undefined4 local_278;
  SyntaxNode *local_268;
  int local_124;
  undefined8 *local_120;
  SyntaxNode *local_118;
  long local_110;
  bool local_101;
  ASTContext *local_100;
  long local_f8;
  char_pointer local_f0;
  table_element_pointer_conflict local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  ASTContext *local_d0;
  long local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_b0;
  ASTContext *local_98;
  long local_90;
  iterator local_88;
  size_t local_78;
  ASTContext *local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  ASTContext *context_00;
  bitmask<slang::ast::LookupFlags> flags;
  
  local_124 = 0;
  local_120 = in_RDX;
  local_118 = in_RSI;
  local_110 = in_RDI;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x481ef7);
  local_268 = local_118;
  if (local_118->kind == ScopedName) {
    slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(local_118);
    local_268 = (SyntaxNode *)
                anon_unknown_39::splitScopedName
                          (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                           in_stack_fffffffffffffc00);
    if (local_124 != 0) {
      local_101 = false;
      goto LAB_00482631;
    }
  }
  anon_unknown_39::NameComponents::NameComponents(in_stack_fffffffffffffbb0);
  SVar1 = (((ExpressionSyntax *)&local_268->kind)->super_SyntaxNode).kind;
  if ((SVar1 == ClassName) || (SVar1 == IdentifierName || SVar1 == IdentifierSelectName)) {
    anon_unknown_39::NameComponents::NameComponents
              (in_stack_fffffffffffffc30,
               (NameSyntax *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
    memcpy(&local_2b0,local_2e8,0x38);
    for (local_2f0 = *(long *)(local_110 + 0x30); lVar2 = local_2f0,
        *(long *)(local_2f0 + 0x80) != 0; local_2f0 = *(long *)(local_2f0 + 0x80)) {
    }
    lVar4 = local_2f0 + 0x48;
    local_100 = &local_2b0;
    local_2f8 = lVar4;
    local_f8 = lVar4;
    local_d0 = local_100;
    local_c8 = lVar4;
    local_98 = local_100;
    local_90 = lVar4;
    local_70 = local_100;
    local_68 = lVar4;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
               ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                           *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    context_00 = local_70;
    result_00 = (LookupResult *)
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                *)in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
    local_20 = local_78;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_30,(size_t)result_00);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                 ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                           *)0x4821fe);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                   ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                               *)0x48225c);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                  *)0x4822af);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                      *)0x4822e3);
          bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                             in_stack_fffffffffffffbc0);
          flags.m_bits = (underlying_type)((ulong)lVar4 >> 0x20);
          if (bVar3) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_004823ff;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8);
      flags.m_bits = (underlying_type)((ulong)lVar4 >> 0x20);
      if (bVar3) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
        ::table_locator(&local_b0);
        goto LAB_004823ff;
      }
      bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,*(size_t *)(lVar2 + 0x50));
      flags.m_bits = (underlying_type)((ulong)lVar4 >> 0x20);
    } while (bVar3);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
    ::table_locator(&local_b0);
LAB_004823ff:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
               ::make_iterator((locator *)0x482410);
    local_e0.pc_ = local_88.pc_;
    local_e0.p_ = local_88.p_;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
    local_f0 = local_c0.pc_;
    local_e8 = local_c0.p_;
    local_308 = local_c0.pc_;
    local_300 = local_c0.p_;
    local_318 = boost::unordered::
                unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                       *)0x4824de);
    bVar3 = boost::unordered::detail::foa::operator==
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffbb0,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffba8);
    if (bVar3) {
      local_101 = false;
    }
    else {
      ppVar5 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_fffffffffffffbb0);
      *local_120 = ppVar5->second;
      std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
      span<slang::SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>_&>
                ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                  *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      local_338 = local_2b0.assertionInstance;
      local_348 = local_2b0.firstTempVar;
      pRStack_340 = local_2b0.randomizeDetails;
      local_358 = local_2b0.flags.m_bits;
      pSStack_350 = local_2b0.instanceOrProc;
      local_368 = local_2b0.scope.ptr;
      SStack_360 = local_2b0.lookupIndex;
      uStack_35c = local_2b0._12_4_;
      bitmask<slang::ast::LookupFlags>::bitmask(&local_36c,None);
      local_101 = anon_unknown_39::lookupDownward
                            (in_stack_00000000,in_stack_00000120,context_00,flags,result_00);
    }
  }
  else {
    local_101 = false;
  }
LAB_00482631:
  local_278 = 1;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL>::~SmallVector
            ((SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> *)0x48263e);
  return (bool)(local_101 & 1);
}

Assistant:

bool Lookup::findAssertionLocalVar(const ASTContext& context, const NameSyntax& syntax,
                                   LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName) {
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);
        if (colonParts)
            return false;
    }

    NameComponents name;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = *first;
            break;
        default:
            return false;
    }

    auto inst = context.assertionInstance;
    SLANG_ASSERT(inst);

    while (inst->argDetails)
        inst = inst->argDetails;

    auto& map = inst->localVars;
    auto it = map.find(name.text);
    if (it == map.end())
        return false;

    result.found = it->second;
    return lookupDownward(nameParts, name, context, LookupFlags::None, result);
}